

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

int double_check_OPP_isomorphism(saucy *s,coloring *c)

{
  int iVar1;
  uint local_3c;
  uint local_38;
  int xor2;
  int xor1;
  int sum2;
  int sum1;
  int v;
  int j;
  int i;
  coloring *c_local;
  saucy *s_local;
  
  if (c == &s->left) {
    s_local._4_4_ = 1;
  }
  else {
    v = s->nsplits;
    do {
      v = v + -1;
      if (v <= s->splitlev[s->lev + -1]) {
        return 1;
      }
      local_38 = 0;
      xor1 = 0;
      for (sum1 = s->adj[c->lab[s->splitwho[v]]]; sum1 < s->adj[c->lab[s->splitwho[v]] + 1];
          sum1 = sum1 + 1) {
        xor1 = c->cfront[s->edg[sum1]] + xor1;
        local_38 = c->cfront[s->edg[sum1]] ^ local_38;
      }
      iVar1 = (s->left).lab[s->splitwho[v]];
      local_3c = 0;
      xor2 = 0;
      for (sum1 = s->adj[iVar1]; sum1 < s->adj[iVar1 + 1]; sum1 = sum1 + 1) {
        xor2 = (s->left).cfront[s->edg[sum1]] + xor2;
        local_3c = (s->left).cfront[s->edg[sum1]] ^ local_3c;
      }
      if ((xor1 != xor2) || (local_38 != local_3c)) {
        return 0;
      }
      local_38 = 0;
      xor1 = 0;
      for (sum1 = s->adj[c->lab[s->splitfrom[v]]]; sum1 < s->adj[c->lab[s->splitfrom[v]] + 1];
          sum1 = sum1 + 1) {
        xor1 = c->cfront[s->edg[sum1]] + xor1;
        local_38 = c->cfront[s->edg[sum1]] ^ local_38;
      }
      iVar1 = (s->left).lab[s->splitfrom[v]];
      local_3c = 0;
      xor2 = 0;
      for (sum1 = s->adj[iVar1]; sum1 < s->adj[iVar1 + 1]; sum1 = sum1 + 1) {
        xor2 = (s->left).cfront[s->edg[sum1]] + xor2;
        local_3c = (s->left).cfront[s->edg[sum1]] ^ local_3c;
      }
    } while ((xor1 == xor2) && (local_38 == local_3c));
    s_local._4_4_ = 0;
  }
  return s_local._4_4_;
}

Assistant:

static int
double_check_OPP_isomorphism(struct saucy *s, struct coloring * c)
{
    /* This is the new enhancement in saucy 3.0 */
    int i, j, v, sum1, sum2, xor1, xor2;

    if (c == &s->left)
        return 1;
    
    for (i = s->nsplits - 1; i > s->splitlev[s->lev-1]; --i) {
        v = c->lab[s->splitwho[i]];
        sum1 = xor1 = 0;
        for (j = s->adj[v]; j < s->adj[v+1]; j++) {
            sum1 += c->cfront[s->edg[j]];
            xor1 ^= c->cfront[s->edg[j]];
        }
        v = s->left.lab[s->splitwho[i]];
        sum2 = xor2 = 0;
        for (j = s->adj[v]; j < s->adj[v+1]; j++) {
            sum2 += s->left.cfront[s->edg[j]];
            xor2 ^= s->left.cfront[s->edg[j]];
        }
        if ((sum1 != sum2) || (xor1 != xor2))
            return 0;
        v = c->lab[s->splitfrom[i]];
        sum1 = xor1 = 0;
        for (j = s->adj[v]; j < s->adj[v+1]; j++) {
            sum1 += c->cfront[s->edg[j]];
            xor1 ^= c->cfront[s->edg[j]];
        }
        v = s->left.lab[s->splitfrom[i]];
        sum2 = xor2 = 0;
        for (j = s->adj[v]; j < s->adj[v+1]; j++) {
            sum2 += s->left.cfront[s->edg[j]];
            xor2 ^= s->left.cfront[s->edg[j]];
        }
        if ((sum1 != sum2) || (xor1 != xor2))
            return 0;
    }   

    return 1;
}